

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

UpdateWitnessStackTxInRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::ConvertToStruct
          (UpdateWitnessStackTxInRequestStruct *__return_storage_ptr__,
          UpdateWitnessStackTxInRequest *this)

{
  WitnessStackDataStruct local_c0;
  
  UpdateWitnessStackTxInRequestStruct::UpdateWitnessStackTxInRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->vout = this->vout_;
  WitnessStackData::ConvertToStruct(&local_c0,&this->witness_stack_);
  WitnessStackDataStruct::operator=(&__return_storage_ptr__->witness_stack,&local_c0);
  WitnessStackDataStruct::~WitnessStackDataStruct(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackTxInRequestStruct UpdateWitnessStackTxInRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackTxInRequestStruct result;
  result.txid = txid_;
  result.vout = vout_;
  result.witness_stack = witness_stack_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}